

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_impl.h
# Opt level: O3

Elem MakeMonic<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *a,
               Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
               *field)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  Elem EVar4;
  long lVar5;
  Elem a_00;
  long lVar6;
  long in_FS_OFFSET;
  Multiplier mul;
  Multiplier MStack_218;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (a->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish[-1];
  if (uVar1 != 1) {
    EVar4 = anon_unknown.dwarf_4126dac::
            Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
            ::Inv((Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                   *)(ulong)uVar1,(Elem)field);
    anon_unknown.dwarf_4126dac::
    Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
    ::Multiplier::Multiplier
              (&MStack_218,
               (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                *)(ulong)EVar4,a_00);
    puVar2 = (a->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2[-1] = 1;
    puVar3 = (a->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)puVar2 - (long)puVar3 >> 2;
    if (lVar5 != 1) {
      lVar6 = 0;
      do {
        uVar1 = puVar3[lVar6];
        puVar3[lVar6] =
             *(uint *)((long)MStack_218.table.rec.trans.table + (ulong)(uVar1 >> 2 & 0x3c)) ^
             MStack_218.table.trans.table[uVar1 & 0xf] ^
             *(uint *)((long)MStack_218.table.rec.rec.trans.table + (ulong)(uVar1 >> 6 & 0x3c)) ^
             *(uint *)((long)&MStack_218.table.rec.rec.rec.trans + (ulong)(uVar1 >> 10 & 0x3c)) ^
             *(uint *)((long)&MStack_218.table.rec.rec.rec.rec + (ulong)(uVar1 >> 0xe & 0x3c)) ^
             *(uint *)((long)&MStack_218.table.rec.rec.rec.rec +
                      (ulong)(uVar1 >> 0x12 & 0x3c) + 0x40) ^
             *(uint *)((long)&MStack_218.table.rec.rec.rec.rec +
                      (ulong)(uVar1 >> 0x16 & 0x3c) + 0x80) ^
             *(uint *)((long)&MStack_218.table.rec.rec.rec.rec + (ulong)(uVar1 >> 0x1c) * 4 + 0xc0);
        lVar6 = lVar6 + 1;
      } while (lVar5 + -1 != lVar6);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (Elem)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

typename F::Elem MakeMonic(std::vector<typename F::Elem>& a, const F& field) {
    CHECK_SAFE(a.back() != 0);
    if (a.back() == 1) return 0;
    auto inv = field.Inv(a.back());
    typename F::Multiplier mul(field, inv);
    a.back() = 1;
    for (size_t i = 0; i < a.size() - 1; ++i) {
        a[i] = mul(a[i]);
    }
    return inv;
}